

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

Status __thiscall leveldb::ModelDB::Write(ModelDB *this,WriteOptions *options,WriteBatch *batch)

{
  Handler *in_RCX;
  Handler handler;
  Handler local_18;
  WriteOptions *local_10;
  
  local_18._vptr_Handler = (_func_int **)&PTR__Handler_0015bde8;
  local_10 = options + 0x68;
  WriteBatch::Iterate((WriteBatch *)this,in_RCX);
  WriteBatch::Handler::~Handler(&local_18);
  return (Status)(char *)this;
}

Assistant:

Status Write(const WriteOptions& options, WriteBatch* batch) override {
    class Handler : public WriteBatch::Handler {
     public:
      KVMap* map_;
      void Put(const Slice& key, const Slice& value) override {
        (*map_)[key.ToString()] = value.ToString();
      }
      void Delete(const Slice& key) override { map_->erase(key.ToString()); }
    };
    Handler handler;
    handler.map_ = &map_;
    return batch->Iterate(&handler);
  }